

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O3

void wavwrite(double *x,int x_length,int fs,int nbit,char *filename)

{
  ulong uVar1;
  FILE *__s;
  ulong uVar2;
  double dVar3;
  double dVar4;
  int16_t tmp_signal;
  int16_t short_number;
  uint32_t long_number;
  undefined2 local_4e;
  int local_4c;
  undefined4 local_48;
  undefined2 local_42;
  ulong local_40;
  int local_34;
  
  __s = fopen(filename,"wb");
  if (__s != (FILE *)0x0) {
    local_48 = 0x46464952;
    local_4c = x_length * 2;
    local_34 = x_length * 2 + 0x24;
    fwrite(&local_48,1,4,__s);
    fwrite(&local_34,4,1,__s);
    local_48 = 0x45564157;
    fwrite(&local_48,1,4,__s);
    local_48 = 0x20746d66;
    fwrite(&local_48,1,4,__s);
    local_34 = 0x10;
    fwrite(&local_34,4,1,__s);
    local_42 = 1;
    local_40 = (ulong)(uint)x_length;
    fwrite(&local_42,2,1,__s);
    local_42 = 1;
    fwrite(&local_42,2,1,__s);
    local_34 = fs;
    fwrite(&local_34,4,1,__s);
    local_34 = fs * 2;
    fwrite(&local_34,4,1,__s);
    local_42 = 2;
    fwrite(&local_42,2,1,__s);
    uVar1 = local_40;
    local_42 = 0x10;
    fwrite(&local_42,2,1,__s);
    local_48 = 0x61746164;
    fwrite(&local_48,1,4,__s);
    local_34 = local_4c;
    fwrite(&local_34,4,1,__s);
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        dVar4 = -32768.0;
        if (-32768.0 <= x[uVar2] * 32767.0) {
          dVar4 = x[uVar2] * 32767.0;
        }
        dVar3 = 32767.0;
        if (dVar4 <= 32767.0) {
          dVar3 = dVar4;
        }
        local_4e = (undefined2)(int)dVar3;
        fwrite(&local_4e,2,1,__s);
        uVar2 = uVar2 + 1;
      } while ((uVar1 & 0xffffffff) != uVar2);
    }
    fclose(__s);
    return;
  }
  puts("File cannot be opened.");
  return;
}

Assistant:

void wavwrite(const double *x, int x_length, int fs, int nbit,
    const char *filename) {
  FILE *fp = fopen(filename, "wb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return;
  }

  char text[4] = {'R', 'I', 'F', 'F'};
  uint32_t long_number = 36 + x_length * 2;
  fwrite(text, 1, 4, fp);
  fwrite(&long_number, 4, 1, fp);

  text[0] = 'W';
  text[1] = 'A';
  text[2] = 'V';
  text[3] = 'E';
  fwrite(text, 1, 4, fp);
  text[0] = 'f';
  text[1] = 'm';
  text[2] = 't';
  text[3] = ' ';
  fwrite(text, 1, 4, fp);

  long_number = 16;
  fwrite(&long_number, 4, 1, fp);
  int16_t short_number = 1;
  fwrite(&short_number, 2, 1, fp);
  short_number = 1;
  fwrite(&short_number, 2, 1, fp);
  long_number = fs;
  fwrite(&long_number, 4, 1, fp);
  long_number = fs * 2;
  fwrite(&long_number, 4, 1, fp);
  short_number = 2;
  fwrite(&short_number, 2, 1, fp);
  short_number = 16;
  fwrite(&short_number, 2, 1, fp);

  text[0] = 'd';
  text[1] = 'a';
  text[2] = 't';
  text[3] = 'a';
  fwrite(text, 1, 4, fp);
  long_number = x_length * 2;
  fwrite(&long_number, 4, 1, fp);

  int16_t tmp_signal;
  for (int i = 0; i < x_length; ++i) {
    tmp_signal = static_cast<int16_t>(MyMaxInt(-32768,
        MyMinInt(32767, static_cast<int>(x[i] * 32767))));
    fwrite(&tmp_signal, 2, 1, fp);
  }

  fclose(fp);
}